

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O0

int unicode_byte_type(char hi,char lo)

{
  uint uVar1;
  int local_c;
  char lo_local;
  char hi_local;
  
  uVar1 = (uint)(byte)hi;
  if (uVar1 - 0xd8 < 4) {
    local_c = 7;
  }
  else if (uVar1 - 0xdc < 4) {
    local_c = 8;
  }
  else if ((uVar1 == 0xff) && (0xfd < (byte)lo)) {
    local_c = 0;
  }
  else {
    local_c = 0x1d;
  }
  return local_c;
}

Assistant:

static int PTRFASTCALL
unicode_byte_type(char hi, char lo) {
  switch ((unsigned char)hi) {
  /* 0xD800-0xDBFF first 16-bit code unit or high surrogate (W1) */
  case 0xD8:
  case 0xD9:
  case 0xDA:
  case 0xDB:
    return BT_LEAD4;
  /* 0xDC00-0xDFFF second 16-bit code unit or low surrogate (W2) */
  case 0xDC:
  case 0xDD:
  case 0xDE:
  case 0xDF:
    return BT_TRAIL;
  case 0xFF:
    switch ((unsigned char)lo) {
    case 0xFF: /* noncharacter-FFFF */
    case 0xFE: /* noncharacter-FFFE */
      return BT_NONXML;
    }
    break;
  }
  return BT_NONASCII;
}